

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstandarditemmodel.cpp
# Opt level: O0

void __thiscall
QStandardItemModel::QStandardItemModel
          (QStandardItemModel *this,int rows,int columns,QObject *parent)

{
  parameter_type ctx;
  QStandardItemModelPrivate *this_00;
  iterator this_01;
  QStandardItem *in_RCX;
  undefined4 in_EDX;
  undefined4 in_ESI;
  QStandardItemPrivate *in_RDI;
  QStandardItemModelPrivate *d;
  parameter_type t;
  QStandardItemModelPrivate *in_stack_ffffffffffffffd0;
  QList<QStandardItem_*> *in_stack_ffffffffffffffd8;
  QStandardItemPrivate *this_02;
  
  this_02 = in_RDI;
  ctx = (parameter_type)operator_new(0x128);
  QStandardItemModelPrivate::QStandardItemModelPrivate(in_stack_ffffffffffffffd0);
  t = ctx;
  QAbstractItemModel::QAbstractItemModel
            ((QAbstractItemModel *)in_RDI,(QAbstractItemModelPrivate *)ctx,(QObject *)in_RCX);
  in_RDI->model = (QStandardItemModel *)&PTR_metaObject_00e20728;
  this_00 = d_func((QStandardItemModel *)0x8d2417);
  QStandardItemModelPrivate::init(this_00,(EVP_PKEY_CTX *)ctx);
  QScopedPointer<QStandardItem,_QScopedPointerDeleter<QStandardItem>_>::operator->(&this_00->root);
  QStandardItem::insertColumns(in_RCX,(int)((ulong)this_00 >> 0x20),(int)this_00);
  this_01 = QList<QStandardItem_*>::insert
                      (in_stack_ffffffffffffffd8,(qsizetype)in_stack_ffffffffffffffd0,
                       (qsizetype)in_RDI,t);
  QScopedPointer<QStandardItem,_QScopedPointerDeleter<QStandardItem>_>::operator->(&this_00->root);
  QStandardItem::insertRows(in_RCX,(int)((ulong)this_00 >> 0x20),(int)this_00);
  QList<QStandardItem_*>::insert
            ((QList<QStandardItem_*> *)this_01.i,(qsizetype)in_stack_ffffffffffffffd0,
             (qsizetype)in_RDI,t);
  QScopedPointer<QStandardItem,_QScopedPointerDeleter<QStandardItem>_>::operator->(&this_00->root);
  QStandardItem::d_func((QStandardItem *)0x8d24c1);
  QStandardItemPrivate::setModel(this_02,(QStandardItemModel *)CONCAT44(in_ESI,in_EDX));
  return;
}

Assistant:

QStandardItemModel::QStandardItemModel(int rows, int columns, QObject *parent)
    : QAbstractItemModel(*new QStandardItemModelPrivate, parent)
{
    Q_D(QStandardItemModel);
    d->init();
    d->root->insertColumns(0, columns);
    d->columnHeaderItems.insert(0, columns, nullptr);
    d->root->insertRows(0, rows);
    d->rowHeaderItems.insert(0, rows, nullptr);
    d->root->d_func()->setModel(this);
}